

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::TabItemBackground(ImDrawList *draw_list,ImRect *bb,ImGuiTabItemFlags flags,ImU32 col)

{
  ImRect *in_RSI;
  ImDrawList *in_RDI;
  float fVar1;
  float y2;
  float y1;
  float rounding;
  float width;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  ImDrawList *pos;
  ImDrawList *in_stack_ffffffffffffff50;
  ImDrawList *this;
  ImDrawList *pIVar2;
  undefined8 in_stack_ffffffffffffff68;
  int a_max_of_12;
  ImDrawList *pIVar3;
  ImDrawList *center;
  ImDrawList *in_stack_ffffffffffffff80;
  ImDrawList *this_00;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  float local_30;
  float local_2c;
  float local_28;
  float local_24;
  ImGuiContext *local_20;
  ImRect *local_10;
  ImDrawList *local_8;
  
  a_max_of_12 = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_20 = GImGui;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24 = ImRect::GetWidth(in_RSI);
  if (local_24 <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x1cb8,"TabItemBackground","ImGui ASSERT FAILED: %s","width > 0.0f");
  }
  fVar1 = ImMin<float>((local_20->Style).TabRounding,local_24 * 0.5 + -1.0);
  local_28 = ImMax<float>(0.0,fVar1);
  local_2c = (local_10->Min).y + 1.0;
  local_30 = (local_10->Max).y - 1.0;
  pIVar3 = local_8;
  ImVec2::ImVec2(&local_38,(local_10->Min).x,local_30);
  ImDrawList::PathLineTo(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  center = local_8;
  ImVec2::ImVec2(&local_40,(local_10->Min).x + local_28,local_2c + local_28);
  ImDrawList::PathArcToFast
            (in_stack_ffffffffffffff80,(ImVec2 *)center,(float)((ulong)pIVar3 >> 0x20),(int)pIVar3,
             a_max_of_12);
  this_00 = local_8;
  ImVec2::ImVec2(&local_48,(local_10->Max).x - local_28,local_2c + local_28);
  ImDrawList::PathArcToFast
            (this_00,(ImVec2 *)center,(float)((ulong)pIVar3 >> 0x20),(int)pIVar3,a_max_of_12);
  ImVec2::ImVec2(&local_50,(local_10->Max).x,local_30);
  ImDrawList::PathLineTo(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  ImDrawList::PathFillConvex
            (in_stack_ffffffffffffff50,(ImU32)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  if (0.0 < (local_20->Style).TabBorderSize) {
    pos = local_8;
    ImVec2::ImVec2(&local_58,(local_10->Min).x + 0.5,local_30);
    ImDrawList::PathLineTo(in_stack_ffffffffffffff50,(ImVec2 *)pos);
    this = local_8;
    ImVec2::ImVec2(&local_60,(local_10->Min).x + local_28 + 0.5,local_2c + local_28 + 0.5);
    ImDrawList::PathArcToFast
              (this_00,(ImVec2 *)center,(float)((ulong)pIVar3 >> 0x20),(int)pIVar3,a_max_of_12);
    pIVar2 = local_8;
    ImVec2::ImVec2(&local_68,((local_10->Max).x - local_28) - 0.5,local_2c + local_28 + 0.5);
    ImDrawList::PathArcToFast
              (this_00,(ImVec2 *)center,(float)((ulong)pIVar3 >> 0x20),(int)pIVar3,a_max_of_12);
    ImVec2::ImVec2(&local_70,(local_10->Max).x - 0.5,local_30);
    ImDrawList::PathLineTo(this,(ImVec2 *)pos);
    fVar1 = (float)((ulong)this >> 0x20);
    GetColorU32((ImGuiCol)((ulong)local_8 >> 0x20),SUB84(local_8,0));
    ImDrawList::PathStroke
              (local_8,(ImU32)((ulong)pIVar2 >> 0x20),SUB81((ulong)pIVar2 >> 0x18,0),fVar1);
  }
  return;
}

Assistant:

void ImGui::TabItemBackground(ImDrawList* draw_list, const ImRect& bb, ImGuiTabItemFlags flags, ImU32 col)
{
    // While rendering tabs, we trim 1 pixel off the top of our bounding box so they can fit within a regular frame height while looking "detached" from it.
    ImGuiContext& g = *GImGui;
    const float width = bb.GetWidth();
    IM_UNUSED(flags);
    IM_ASSERT(width > 0.0f);
    const float rounding = ImMax(0.0f, ImMin(g.Style.TabRounding, width * 0.5f - 1.0f));
    const float y1 = bb.Min.y + 1.0f;
    const float y2 = bb.Max.y - 1.0f;
    draw_list->PathLineTo(ImVec2(bb.Min.x, y2));
    draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding, y1 + rounding), rounding, 6, 9);
    draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding, y1 + rounding), rounding, 9, 12);
    draw_list->PathLineTo(ImVec2(bb.Max.x, y2));
    draw_list->PathFillConvex(col);
    if (g.Style.TabBorderSize > 0.0f)
    {
        draw_list->PathLineTo(ImVec2(bb.Min.x + 0.5f, y2));
        draw_list->PathArcToFast(ImVec2(bb.Min.x + rounding + 0.5f, y1 + rounding + 0.5f), rounding, 6, 9);
        draw_list->PathArcToFast(ImVec2(bb.Max.x - rounding - 0.5f, y1 + rounding + 0.5f), rounding, 9, 12);
        draw_list->PathLineTo(ImVec2(bb.Max.x - 0.5f, y2));
        draw_list->PathStroke(GetColorU32(ImGuiCol_Border), false, g.Style.TabBorderSize);
    }
}